

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

bool __thiscall
pbrt::Curve::RecursiveIntersect
          (Curve *this,Ray *ray,Float tMax,span<const_pbrt::Point3<float>_> cp,
          Transform *ObjectFromRay,Float u0,Float u1,int depth,optional<pbrt::ShapeIntersection> *si
          )

{
  float fVar1;
  Float u1_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ulong uVar6;
  CurveCommon *pCVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  long lVar21;
  Point3<float> *pPVar22;
  Point3<float> *deriv;
  pbrt *this_00;
  long in_R11;
  bool bVar23;
  long in_FS_OFFSET;
  undefined8 uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZmmResult [64];
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [56];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar46 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar48 [60];
  undefined1 auVar47 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_register_00001284 [60];
  float x;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar59 [64];
  float fVar60;
  float fVar62;
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  Point3<float> PVar68;
  Vector3<float> VVar69;
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  span<const_pbrt::Point3<float>_> cp_02;
  float fStack_318;
  Tuple3<pbrt::Vector3,_float> local_2e8;
  Tuple3<pbrt::Normal3,_float> local_2d8;
  Tuple3<pbrt::Vector3,_float> local_2c8;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  Point3fi pi;
  undefined8 local_278;
  undefined4 local_270;
  undefined1 local_268 [16];
  Point2f local_250;
  array<pbrt::Point3<float>,_7> cpSplit;
  Float FStack_1f4;
  Tuple3<pbrt::Normal3,_float> local_150;
  Tuple3<pbrt::Normal3,_float> local_140;
  Vector3f pError;
  Vector3f vb;
  float fStack_11c;
  Interval<float> IStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  Tuple3<pbrt::Normal3,_float> aTStack_100 [2];
  MediumInterface *local_e8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_e0;
  Tuple3<pbrt::Vector3,_float> local_d8 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_c0 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_a8 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_90 [2];
  Tuple3<pbrt::Normal3,_float> TStack_78;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_68;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  TStack_60;
  Tuple3<pbrt::Vector3,_float> local_58 [3];
  undefined1 auVar58 [16];
  
  auVar26 = in_ZMM10._0_16_;
  auVar64._4_60_ = in_register_00001284;
  auVar64._0_4_ = u1;
  auVar67._4_60_ = in_register_00001244;
  auVar67._0_4_ = u0;
  pPVar22 = (Point3<float> *)cp.n;
  this_00 = (pbrt *)cp.ptr;
  auVar59._16_48_ = in_ZmmResult._16_48_;
  auVar28 = auVar67._0_16_;
  auVar67 = ZEXT1664(auVar28);
  if (depth < 1) {
    fVar57 = *(float *)this_00;
    fVar33 = *(float *)(this_00 + 4);
    auVar27 = vfnmadd231ss_fma(ZEXT416((uint)(fVar57 * (fVar57 - *(float *)(this_00 + 0xc)))),
                               ZEXT416((uint)fVar33),
                               ZEXT416((uint)(*(float *)(this_00 + 0x10) - fVar33)));
    if (0.0 <= auVar27._0_4_) {
      fVar1 = *(float *)(this_00 + 0x24);
      fVar34 = *(float *)(this_00 + 0x28);
      auVar27 = vfnmadd231ss_fma(ZEXT416((uint)(fVar1 * (fVar1 - *(float *)(this_00 + 0x18)))),
                                 ZEXT416((uint)fVar34),
                                 ZEXT416((uint)(*(float *)(this_00 + 0x1c) - fVar34)));
      if (0.0 <= auVar27._0_4_) {
        fVar1 = fVar1 - fVar57;
        fVar34 = fVar34 - fVar33;
        fVar54 = fVar34 * fVar34 + fVar1 * fVar1;
        if ((fVar54 != 0.0) || (NAN(fVar54))) {
          fVar12 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
          auVar27._8_4_ = 0x80000000;
          auVar27._0_8_ = 0x8000000080000000;
          auVar27._12_4_ = 0x80000000;
          auVar32 = vxorps_avx512vl(ZEXT416((uint)fVar33),auVar27);
          pCVar11 = this->common;
          auVar27 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
          auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar27,auVar27);
          auVar53 = ZEXT416((uint)(fVar34 * auVar32._0_4_));
          auVar37 = vfnmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar57),auVar53);
          auVar32 = vfmsub213ss_fma(ZEXT416((uint)fVar34),auVar32,auVar53);
          auVar53 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z);
          auVar27 = vfmadd213ss_fma(auVar53,auVar53,auVar27);
          auVar27 = vsqrtss_avx(auVar27,auVar27);
          fVar54 = (auVar37._0_4_ + auVar32._0_4_) / fVar54;
          fVar57 = auVar27._0_4_;
          auVar32 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar54 * u1)),auVar28,
                                        ZEXT416((uint)(1.0 - fVar54)));
          auVar27 = vminss_avx(auVar64._0_16_,auVar32);
          uVar24 = vcmpss_avx512f(auVar32,auVar28,1);
          bVar20 = (bool)((byte)uVar24 & 1);
          auVar59._0_16_ = auVar27;
          auVar66._4_60_ = auVar59._4_60_;
          auVar66._0_4_ = (float)((uint)bVar20 * (int)u0 + (uint)!bVar20 * auVar27._0_4_);
          local_2a8 = auVar66._0_16_;
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * pCVar11->width[1])),
                                    ZEXT416((uint)(1.0 - auVar66._0_4_)),
                                    ZEXT416((uint)pCVar11->width[0]));
          fStack_318 = auVar28._0_4_;
          local_2d8.x = 0.0;
          local_2d8.y = 0.0;
          local_2d8.z = 0.0;
          deriv = pPVar22;
          if (pCVar11->type == Ribbon) {
            fVar33 = sinf((1.0 - auVar66._0_4_) * pCVar11->normalAngle);
            local_2b8 = ZEXT416((uint)(fVar33 * this->common->invSinNormalAngle));
            fVar33 = sinf((float)local_2a8._0_4_ * this->common->normalAngle);
            pCVar11 = this->common;
            uVar2 = pCVar11->n[0].super_Tuple3<pbrt::Normal3,_float>.y;
            uVar7 = pCVar11->n[0].super_Tuple3<pbrt::Normal3,_float>.z;
            fVar33 = fVar33 * pCVar11->invSinNormalAngle;
            uVar3 = pCVar11->n[1].super_Tuple3<pbrt::Normal3,_float>.y;
            uVar8 = pCVar11->n[1].super_Tuple3<pbrt::Normal3,_float>.z;
            auVar37._0_4_ = (float)local_2b8._0_4_ * (float)uVar2 + fVar33 * (float)uVar3;
            auVar37._4_4_ = (float)local_2b8._0_4_ * (float)uVar7 + fVar33 * (float)uVar8;
            auVar37._8_4_ = (float)local_2b8._0_4_ * 0.0 + fVar33 * 0.0;
            auVar37._12_4_ = (float)local_2b8._0_4_ * 0.0 + fVar33 * 0.0;
            auVar27 = ZEXT416((uint)((float)local_2b8._0_4_ *
                                     pCVar11->n[0].super_Tuple3<pbrt::Normal3,_float>.x +
                                    fVar33 * pCVar11->n[1].super_Tuple3<pbrt::Normal3,_float>.x));
            auVar28 = vunpcklps_avx(auVar27,auVar37);
            local_2d8._0_8_ = vmovlps_avx(auVar28);
            local_2d8.z = (float)vextractps_avx(auVar37,1);
            uVar25._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
            uVar25._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar25;
            auVar55._0_4_ = auVar37._0_4_ * (float)(undefined4)uVar25;
            auVar55._4_4_ = auVar37._4_4_ * (float)uVar25._4_4_;
            auVar55._8_4_ = auVar37._8_4_ * 0.0;
            auVar55._12_4_ = auVar37._12_4_ * 0.0;
            auVar28._8_4_ = 0x80000000;
            auVar28._0_8_ = 0x8000000080000000;
            auVar28._12_4_ = 0x80000000;
            auVar28 = vxorps_avx512vl(auVar55,auVar28);
            auVar28 = vpermi2ps_avx512vl(_DAT_00603510,auVar55,auVar28);
            auVar28 = vfmadd231ps_fma(auVar28,auVar37,auVar53);
            auVar28 = vhaddps_avx(auVar28,auVar28);
            auVar28 = vfmadd231ss_fma(auVar28,auVar27,
                                      ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
            auVar32._8_4_ = 0x7fffffff;
            auVar32._0_8_ = 0x7fffffff7fffffff;
            auVar32._12_4_ = 0x7fffffff;
            auVar28 = vandps_avx512vl(auVar28,auVar32);
            fStack_318 = fStack_318 * (auVar28._0_4_ / fVar57);
          }
          uVar24 = vcmpss_avx512f(ZEXT416((uint)fVar54),ZEXT816(0) << 0x40,1);
          local_278 = 0;
          local_270 = 0;
          auVar28 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar54));
          auVar45 = ZEXT856(auVar28._8_8_);
          cp_00.n = (size_t)&local_278;
          cp_00.ptr = pPVar22;
          PVar68 = EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
                             (this_00,cp_00,(Float)((uint)!(bool)((byte)uVar24 & 1) * auVar28._0_4_)
                              ,(Vector3<float> *)deriv);
          fVar33 = PVar68.super_Tuple3<pbrt::Point3,_float>.z;
          auVar41._0_8_ = PVar68.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar41._8_56_ = auVar45;
          auVar27 = auVar41._0_16_;
          auVar28 = vmovshdup_avx(auVar27);
          auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar28._0_4_ * auVar28._0_4_)),auVar27,auVar27);
          if (auVar27._0_4_ <= fStack_318 * fStack_318 * 0.25) {
            if (fVar33 < 0.0) {
              return false;
            }
            if (fVar33 <= fVar57 * tMax) {
              if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
                fVar33 = fVar33 / fVar57;
                if ((si->set == true) && (*(float *)((long)&si->optionalValue + 0xf8) < fVar33)) {
                  return false;
                }
                local_2c8.x = 0.0;
                local_2c8.y = 0.0;
                local_2c8.z = 0.0;
                auVar28 = vfnmadd231ss_fma(ZEXT416((uint)(PVar68.super_Tuple3<pbrt::Point3,_float>.x
                                                         * local_278._4_4_)),auVar28,
                                           ZEXT416((uint)local_278));
                cp_01.n = (size_t)&local_2c8;
                cp_01.ptr = (Point3<float> *)&DAT_00000004;
                EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
                          ((pbrt *)this->common->cpObj,cp_01,(Float)local_2a8._0_4_,
                           (Vector3<float> *)deriv);
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
                vb.super_Tuple3<pbrt::Vector3,_float>.x = local_2c8.x;
                vb.super_Tuple3<pbrt::Vector3,_float>.y = local_2c8.y;
                uVar24 = vb.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                vb.super_Tuple3<pbrt::Vector3,_float>.x = local_2c8.x;
                vb.super_Tuple3<pbrt::Vector3,_float>.z = local_2c8.z;
                vb.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar24;
                if (vb.super_Tuple3<pbrt::Vector3,_float>.x == 0.0) {
                  vb.super_Tuple3<pbrt::Vector3,_float>.y = local_2c8.y;
                  if ((((vb.super_Tuple3<pbrt::Vector3,_float>.y == 0.0) &&
                       (!NAN(vb.super_Tuple3<pbrt::Vector3,_float>.y))) && (local_2c8.z == 0.0)) &&
                     (!NAN(local_2c8.z))) {
                    LogFatal<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.cpp"
                               ,0x2aa,"Check failed: %s != %s with %s = %s, %s = %s",
                               (char (*) [18])"Vector3f(0, 0, 0)",(char (*) [5])"dpdu",
                               (char (*) [18])"Vector3f(0, 0, 0)",(Vector3<float> *)&cpSplit,
                               (char (*) [5])"dpdu",&vb);
                  }
                }
                auVar26 = vsqrtss_avx(auVar26,ZEXT416((uint)auVar27._0_4_));
                uVar24 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416(auVar28._0_4_),1);
                bVar20 = (bool)((byte)uVar24 & 1);
                auVar38._0_4_ = auVar26._0_4_ / fStack_318;
                auVar38._4_12_ = auVar26._4_12_;
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar28 = vxorps_avx512vl(auVar38,auVar26);
                auVar48 = ZEXT1260(auVar28._4_12_);
                fVar57 = (float)((uint)bVar20 * (int)auVar38._0_4_ + (uint)!bVar20 * auVar28._0_4_)
                         + 0.5;
                auVar45 = (undefined1  [56])0x0;
                if (this->common->type == Ribbon) {
                  VVar69 = Cross<float>((Normal3<float> *)&local_2d8,(Vector3<float> *)&local_2c8);
                  auVar47._0_4_ = VVar69.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar47._4_60_ = auVar48;
                  auVar42._0_8_ = VVar69.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar42._8_56_ = auVar45;
                  auVar26 = auVar42._0_16_;
                  auVar50._0_4_ =
                       VVar69.super_Tuple3<pbrt::Vector3,_float>.x *
                       VVar69.super_Tuple3<pbrt::Vector3,_float>.x;
                  auVar50._4_4_ =
                       VVar69.super_Tuple3<pbrt::Vector3,_float>.y *
                       VVar69.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar50._8_4_ = auVar45._0_4_ * auVar45._0_4_;
                  auVar50._12_4_ = auVar45._4_4_ * auVar45._4_4_;
                  auVar28 = vmovshdup_avx(auVar50);
                  auVar28 = vfmadd231ss_fma(auVar28,auVar26,auVar26);
                  auVar28 = vfmadd231ss_fma(auVar28,auVar47._0_16_,auVar47._0_16_);
                  auVar28 = vsqrtss_avx(auVar28,auVar28);
                  auVar51._0_4_ = auVar28._0_4_;
                  auVar51._4_4_ = auVar51._0_4_;
                  auVar51._8_4_ = auVar51._0_4_;
                  auVar51._12_4_ = auVar51._0_4_;
                  auVar28 = vdivps_avx(auVar26,auVar51);
                  local_2e8.z = fStack_318 * (auVar47._0_4_ / auVar51._0_4_);
                  auVar39._0_4_ = fStack_318 * auVar28._0_4_;
                  auVar39._4_4_ = fStack_318 * auVar28._4_4_;
                  auVar39._8_4_ = fStack_318 * auVar28._8_4_;
                  auVar39._12_4_ = fStack_318 * auVar28._12_4_;
                  local_2e8._0_8_ = vmovlps_avx(auVar39);
                }
                else {
                  VVar69 = Transform::ApplyInverse<float>
                                     (ObjectFromRay,(Vector3<float> *)&local_2c8);
                  vb.super_Tuple3<pbrt::Vector3,_float>.z =
                       VVar69.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar43._0_8_ = VVar69.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar43._8_56_ = auVar45;
                  fVar34 = VVar69.super_Tuple3<pbrt::Vector3,_float>.x;
                  vb.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar43._0_16_);
                  auVar28 = vmovshdup_avx(auVar43._0_16_);
                  auVar19._8_4_ = 0x80000000;
                  auVar19._0_8_ = 0x8000000080000000;
                  auVar19._12_4_ = 0x80000000;
                  auVar26 = vxorps_avx512vl(auVar28,auVar19);
                  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),auVar28,auVar28);
                  auVar28 = vsqrtss_avx(auVar28,auVar28);
                  fVar54 = auVar28._0_4_;
                  fVar1 = fStack_318 * (0.0 / fVar54);
                  auVar26 = ZEXT416((uint)(fStack_318 * (auVar26._0_4_ / fVar54)));
                  auVar27 = ZEXT416((uint)(fStack_318 * (fVar34 / fVar54)));
                  auVar28 = vinsertps_avx(auVar26,auVar27,0x10);
                  uVar25 = auVar28._8_8_;
                  pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                       (Interval<float>)vmovlps_avx(auVar28);
                  pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = fVar1;
                  if (this->common->type == Cylinder) {
                    auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * 90.0)),
                                              ZEXT416((uint)(1.0 - fVar57)),ZEXT416(0xc2b40000));
                    fVar34 = auVar28._0_4_ * -0.017453292;
                    local_2b8 = auVar26;
                    local_268 = auVar27;
                    fVar54 = sinf(fVar34);
                    fVar34 = cosf(fVar34);
                    Rotate((Transform *)&cpSplit,fVar54,fVar34,&vb);
                    auVar28 = vfmadd231ss_fma(ZEXT416((uint)((float)local_268._0_4_ *
                                                            cpSplit.values[0].
                                                            super_Tuple3<pbrt::Point3,_float>.y)),
                                              local_2b8,
                                              ZEXT416((uint)cpSplit.values[0].
                                                            super_Tuple3<pbrt::Point3,_float>.x));
                    auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)local_268._0_4_ *
                                                            cpSplit.values[1].
                                                            super_Tuple3<pbrt::Point3,_float>.z)),
                                              local_2b8,
                                              ZEXT416((uint)cpSplit.values[1].
                                                            super_Tuple3<pbrt::Point3,_float>.y));
                    auVar27 = vfmadd231ss_fma(ZEXT416((uint)((float)local_268._0_4_ *
                                                            cpSplit.values[3].
                                                            super_Tuple3<pbrt::Point3,_float>.x)),
                                              local_2b8,
                                              ZEXT416((uint)cpSplit.values[2].
                                                            super_Tuple3<pbrt::Point3,_float>.z));
                    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar1),
                                              ZEXT416((uint)cpSplit.values[0].
                                                            super_Tuple3<pbrt::Point3,_float>.z));
                    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar1),
                                              ZEXT416((uint)cpSplit.values[2].
                                                            super_Tuple3<pbrt::Point3,_float>.x));
                    auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar1),
                                              ZEXT416((uint)cpSplit.values[3].
                                                            super_Tuple3<pbrt::Point3,_float>.y));
                    auVar28 = vinsertps_avx(auVar28,auVar26,0x10);
                    uVar25 = auVar28._8_8_;
                    pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                         (Interval<float>)vmovlps_avx(auVar28);
                    pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar27._0_4_;
                  }
                  auVar45 = ZEXT856(uVar25);
                  VVar69 = Transform::operator()(ObjectFromRay,(Vector3<float> *)&pi);
                  local_2e8.z = VVar69.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar44._0_8_ = VVar69.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar44._8_56_ = auVar45;
                  local_2e8._0_8_ = vmovlps_avx(auVar44._0_16_);
                }
                pError.super_Tuple3<pbrt::Vector3,_float>.x = fStack_318 + fStack_318;
                uVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
                uVar9 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
                uVar5 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
                uVar10 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z =
                     fVar33 * (ray->d).super_Tuple3<pbrt::Vector3,_float>.z +
                     (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
                bVar20 = this->common->reverseOrientation;
                bVar23 = this->common->transformSwapsHandedness;
                auVar46._0_4_ = fVar33 * (float)uVar4 + (float)uVar5;
                auVar46._4_4_ = fVar33 * (float)uVar9 + (float)uVar10;
                auVar46._8_4_ = fVar33 * 0.0 + 0.0;
                auVar46._12_4_ = fVar33 * 0.0 + 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar46);
                pError.super_Tuple3<pbrt::Vector3,_float>.y =
                     pError.super_Tuple3<pbrt::Vector3,_float>.x;
                pError.super_Tuple3<pbrt::Vector3,_float>.z =
                     pError.super_Tuple3<pbrt::Vector3,_float>.x;
                Point3fi::Point3fi(&pi,cpSplit.values,&pError);
                local_250.super_Tuple2<pbrt::Point2,_float>.x = (float)local_2a8._0_4_;
                uVar6._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
                uVar6._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
                local_140.z = 0.0;
                local_140.x = 0.0;
                local_140.y = 0.0;
                local_150.z = 0.0;
                local_150.x = 0.0;
                local_150.y = 0.0;
                auVar40._0_8_ = uVar6 ^ 0x8000000080000000;
                auVar40._8_4_ = 0x80000000;
                auVar40._12_4_ = 0x80000000;
                vb.super_Tuple3<pbrt::Vector3,_float>.z =
                     -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
                vb.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar40);
                local_250.super_Tuple2<pbrt::Point2,_float>.y = fVar57;
                SurfaceInteraction::SurfaceInteraction
                          ((SurfaceInteraction *)&cpSplit,&pi,&local_250,&vb,(Vector3f *)&local_2c8,
                           (Vector3f *)&local_2e8,(Normal3f *)&local_140,(Normal3f *)&local_150,
                           ray->time,bVar20 != bVar23);
                Transform::operator()
                          ((SurfaceInteraction *)&vb,this->common->renderFromObject,
                           (SurfaceInteraction *)&cpSplit);
                *(MediumInterface **)((long)&si->optionalValue + 0x40) = local_e8;
                (si->optionalValue).__align =
                     (anon_struct_8_0_00000001_for___align)
                     vb.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                *(ulong *)((long)&si->optionalValue + 8) =
                     CONCAT44(fStack_11c,vb.super_Tuple3<pbrt::Vector3,_float>.z);
                *(Interval<float> *)((long)&si->optionalValue + 0x10) = IStack_118;
                *(undefined8 *)((long)&si->optionalValue + 0x18) = uStack_110;
                *(undefined8 *)((long)&si->optionalValue + 0x20) = uStack_108;
                *(undefined8 *)((long)&si->optionalValue + 0x28) = aTStack_100[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x30) = aTStack_100._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x38) = aTStack_100[1]._4_8_;
                ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                  *)((long)&si->optionalValue + 0x48))->bits = local_e0.bits;
                *(undefined8 *)((long)&si->optionalValue + 0x50) = local_d8[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x58) = local_d8._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x60) = local_d8[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x68) = aTStack_c0[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x70) = aTStack_c0._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x78) = aTStack_c0[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x80) = aTStack_a8[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x88) = aTStack_a8._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x80) = aTStack_a8[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x88) = aTStack_a8._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x90) = aTStack_a8[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0x98) = aTStack_90[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xa0) = aTStack_90._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xa8) = aTStack_90[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xb0) = TStack_78._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xb8) = stack0xffffffffffffff90;
                ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                  *)((long)&si->optionalValue + 0xc0))->bits = local_68.bits;
                ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                  *)((long)&si->optionalValue + 200))->bits = TStack_60.bits;
                *(undefined8 *)((long)&si->optionalValue + 0xd0) = local_58[0]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xd8) = local_58._8_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xe0) = local_58[1]._4_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xe8) = local_58[2]._0_8_;
                *(undefined8 *)((long)&si->optionalValue + 0xf0) = stack0xffffffffffffffc8;
                *(float *)((long)&si->optionalValue + 0xf8) = fVar33;
                si->set = true;
              }
              *(long *)(in_FS_OFFSET + -0x480) = *(long *)(in_FS_OFFSET + -0x480) + 1;
              return true;
            }
            return false;
          }
        }
      }
    }
  }
  else {
    fVar57 = *(float *)(this_00 + 0x14);
    fVar33 = *(float *)(this_00 + 8);
    fVar1 = *(float *)(this_00 + 0x20);
    auVar26 = vmulss_avx512f(ZEXT416((uint)(fVar33 + fVar57)),ZEXT416(0x3f000000));
    fVar34 = *(float *)(this_00 + 0x2c);
    fVar54 = (float)*(undefined8 *)(this_00 + 0xc);
    fVar60 = (float)*(undefined8 *)this_00;
    fVar13 = (float)((ulong)*(undefined8 *)(this_00 + 0xc) >> 0x20);
    fVar62 = (float)((ulong)*(undefined8 *)this_00 >> 0x20);
    cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = *(float *)(this_00 + 8);
    auVar65._0_4_ = (fVar60 + fVar54) * 0.5;
    auVar65._4_4_ = (fVar62 + fVar13) * 0.5;
    auVar65._8_8_ = 0;
    auVar27 = vmulss_avx512f(ZEXT416((uint)(fVar1 + fVar34)),ZEXT416(0x3f000000));
    cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)this_00;
    uVar24 = vmovlps_avx(auVar65);
    cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar24;
    cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar24 >> 0x20);
    cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.z = auVar26._0_4_;
    auVar66 = ZEXT864(0);
    fVar15 = (float)*(undefined8 *)(this_00 + 0x18);
    fVar16 = (float)((ulong)*(undefined8 *)(this_00 + 0x18) >> 0x20);
    fVar12 = (float)*(undefined8 *)(this_00 + 0x24);
    auVar63._0_4_ = fVar60 + fVar54 * 3.0 + fVar15 * 3.0 + fVar12;
    fVar14 = (float)((ulong)*(undefined8 *)(this_00 + 0x24) >> 0x20);
    auVar63._4_4_ = fVar62 + fVar13 * 3.0 + fVar16 * 3.0 + fVar14;
    auVar63._8_8_ = 0;
    auVar18._8_4_ = 0x3e000000;
    auVar18._0_8_ = 0x3e0000003e000000;
    auVar18._12_4_ = 0x3e000000;
    auVar26 = vmulps_avx512vl(auVar63,auVar18);
    auVar61._0_4_ = (fVar60 + fVar54 + fVar54 + fVar15) * 0.25;
    auVar61._4_4_ = (fVar62 + fVar13 + fVar13 + fVar16) * 0.25;
    auVar61._8_8_ = 0;
    auVar56._0_4_ = (fVar15 + fVar12) * 0.5;
    auVar56._4_4_ = (fVar16 + fVar14) * 0.5;
    auVar56._8_8_ = 0;
    auVar58._0_4_ = (fVar54 + fVar15 + fVar15 + fVar12) * 0.25;
    auVar58._4_4_ = (fVar13 + fVar16 + fVar16 + fVar14) * 0.25;
    auVar58._8_8_ = 0;
    auVar59 = ZEXT1664(auVar58);
    uVar24 = vmovlps_avx(auVar61);
    cpSplit.values[2].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar24;
    cpSplit.values[2].super_Tuple3<pbrt::Point3,_float>.y = SUB84(uVar24,4);
    cpSplit.values[2].super_Tuple3<pbrt::Point3,_float>.z =
         (fVar33 + fVar57 + fVar57 + fVar1) * 0.25;
    uVar24 = vmovlps_avx(auVar26);
    cpSplit.values[3].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar24;
    cpSplit.values[3].super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar24 >> 0x20);
    cpSplit.values[3].super_Tuple3<pbrt::Point3,_float>.z =
         (fVar57 * 3.0 + fVar33 + fVar1 * 3.0 + fVar34) * 0.125;
    auVar28 = vaddss_avx512f(auVar28,auVar64._0_16_);
    auVar64 = ZEXT864(0) << 0x20;
    uVar24 = vmovlps_avx(auVar58);
    cpSplit.values[4].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar24;
    cpSplit.values[4].super_Tuple3<pbrt::Point3,_float>.y = SUB84(uVar24,4);
    cpSplit.values[4].super_Tuple3<pbrt::Point3,_float>.z = (fVar1 + fVar1 + fVar57 + fVar34) * 0.25
    ;
    uVar24 = vmovlps_avx(auVar56);
    cpSplit.values[5].super_Tuple3<pbrt::Point3,_float>.x = (float)uVar24;
    cpSplit.values[5].super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar24 >> 0x20);
    cpSplit.values[5].super_Tuple3<pbrt::Point3,_float>.z = auVar27._0_4_;
    auVar28 = vmulss_avx512f(auVar28,ZEXT416(0x3f000000));
    cpSplit.values[6].super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(this_00 + 0x24);
    vb.super_Tuple3<pbrt::Vector3,_float>.y = auVar28._0_4_;
    vb.super_Tuple3<pbrt::Vector3,_float>.z = u1;
    cpSplit.values[6].super_Tuple3<pbrt::Point3,_float>.z = *(Float *)(this_00 + 0x2c);
    lVar21 = 0;
    bVar20 = true;
    do {
      bVar23 = bVar20;
      auVar28 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar67._0_16_);
      auVar27 = ZEXT416((uint)this->common->width[1]);
      auVar26 = vmulss_avx512f(auVar67._0_16_,auVar27);
      u1_00 = (&vb.super_Tuple3<pbrt::Vector3,_float>.y)[lVar21];
      auVar32 = ZEXT416((uint)this->common->width[0]);
      auVar28 = vfmadd231ss_fma(auVar26,auVar32,auVar28);
      auVar26 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)u1_00));
      auVar27 = vmulss_avx512f(auVar27,ZEXT416((uint)u1_00));
      auVar26 = vfmadd231ss_fma(auVar27,auVar32,auVar26);
      auVar28 = vmaxss_avx(auVar26,auVar28);
      auVar27 = vmulss_avx512f(auVar28,SUB6416(ZEXT464(0x3f000000),0));
      auVar32 = ZEXT416((uint)cpSplit.values[lVar21 * 3].super_Tuple3<pbrt::Point3,_float>.x);
      auVar37 = ZEXT416((uint)cpSplit.values[lVar21 * 3 + 1].super_Tuple3<pbrt::Point3,_float>.x);
      auVar28 = vminss_avx(auVar37,auVar32);
      auVar53 = ZEXT416((uint)cpSplit.values[lVar21 * 3 + 3].super_Tuple3<pbrt::Point3,_float>.x);
      auVar55 = ZEXT416((uint)cpSplit.values[lVar21 * 3 + 2].super_Tuple3<pbrt::Point3,_float>.x);
      auVar26 = vminss_avx(auVar53,auVar55);
      auVar28 = vminss_avx(auVar26,auVar28);
      auVar35._0_4_ = auVar27._0_4_;
      if (auVar28._0_4_ - auVar35._0_4_ <= 0.0) {
        auVar28 = vmaxss_avx(auVar37,auVar32);
        auVar26 = vmaxss_avx(auVar53,auVar55);
        auVar28 = vmaxss_avx(auVar26,auVar28);
        if (0.0 <= auVar35._0_4_ + auVar28._0_4_) {
          fVar57 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
          pPVar22 = cpSplit.values + lVar21 * 3;
          auVar28 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar57)),auVar28,auVar28);
          auVar26 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z);
          auVar28 = vfmadd231ss_fma(auVar28,auVar26,auVar26);
          auVar37 = vsqrtss_avx(auVar28,auVar28);
          auVar35._4_4_ = auVar35._0_4_;
          auVar35._8_4_ = auVar35._0_4_;
          auVar35._12_4_ = auVar35._0_4_;
          auVar26 = vgatherdps_avx512vl(*(undefined4 *)
                                         ((long)&(pPVar22->super_Tuple3<pbrt::Point3,_float>).x +
                                         in_R11));
          auVar27 = vgatherdps_avx512vl(*(undefined4 *)
                                         ((long)&si->optionalValue +
                                         (long)&pPVar22->super_Tuple3<pbrt::Point3,_float>));
          uVar24 = vcmpps_avx512vl(auVar26,auVar27,1);
          uVar25 = vcmpps_avx512vl(auVar27,auVar26,1);
          auVar28 = vblendps_avx(auVar27,auVar26,6);
          auVar26 = vblendps_avx(auVar26,auVar27,6);
          auVar32 = vshufpd_avx(auVar26,auVar26,1);
          auVar27 = vpmovm2d_avx512vl(uVar24);
          auVar27 = vpshufd_avx(auVar27,0x4e);
          auVar26 = vblendmps_avx512vl(auVar26,auVar28);
          bVar20 = (bool)((byte)uVar25 & 1);
          auVar29._0_4_ = (uint)bVar20 * auVar26._0_4_ | (uint)!bVar20 * auVar59._0_4_;
          bVar20 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar29._4_4_ = (uint)bVar20 * auVar26._4_4_ | (uint)!bVar20 * auVar59._4_4_;
          bVar20 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar29._8_4_ = (uint)bVar20 * auVar26._8_4_ | (uint)!bVar20 * auVar59._8_4_;
          bVar20 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar29._12_4_ = (uint)bVar20 * auVar26._12_4_ | (uint)!bVar20 * auVar59._12_4_;
          auVar59 = ZEXT1664(auVar29);
          uVar25 = vpmovd2m_avx512vl(auVar27);
          auVar28 = vshufpd_avx(auVar28,auVar28,1);
          bVar20 = (bool)((byte)uVar25 & 1);
          auVar30._0_4_ = (uint)bVar20 * auVar28._0_4_ | (uint)!bVar20 * auVar32._0_4_;
          bVar20 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar30._4_4_ = (uint)bVar20 * auVar28._4_4_ | (uint)!bVar20 * auVar32._4_4_;
          bVar20 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar30._8_4_ = (uint)bVar20 * auVar28._8_4_ | (uint)!bVar20 * auVar32._8_4_;
          bVar20 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar30._12_4_ = (uint)bVar20 * auVar28._12_4_ | (uint)!bVar20 * auVar32._12_4_;
          uVar25 = vcmpps_avx512vl(auVar29,auVar30,1);
          auVar28 = vblendps_avx(auVar29,auVar30,6);
          auVar26 = vblendps_avx(auVar30,auVar29,6);
          bVar20 = (bool)((byte)uVar25 & 1);
          auVar31._0_4_ = (float)((uint)bVar20 * auVar28._0_4_ | (uint)!bVar20 * auVar26._0_4_);
          bVar20 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar31._4_4_ = (float)((uint)bVar20 * auVar28._4_4_ | (uint)!bVar20 * auVar26._4_4_);
          bVar20 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar31._8_4_ = (float)((uint)bVar20 * auVar28._8_4_ | (uint)!bVar20 * auVar26._8_4_);
          bVar20 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar31._12_4_ = (float)((uint)bVar20 * auVar28._12_4_ | (uint)!bVar20 * auVar26._12_4_);
          auVar28 = vsubps_avx(auVar31,auVar35);
          auVar36._0_4_ = auVar31._0_4_ + auVar35._0_4_;
          auVar36._4_4_ = auVar31._4_4_ + auVar35._0_4_;
          auVar36._8_4_ = auVar31._8_4_ + auVar35._0_4_;
          auVar36._12_4_ = auVar31._12_4_ + auVar35._0_4_;
          auVar28 = vblendps_avx(auVar28,auVar36,6);
          auVar27 = ZEXT416((uint)(tMax * auVar37._0_4_));
          auVar26 = vmaxss_avx(auVar27,auVar64._0_16_);
          auVar27 = vminss_avx(auVar27,auVar64._0_16_);
          auVar52._0_4_ = auVar26._0_4_;
          auVar52._4_12_ = auVar66._4_12_;
          auVar49._0_4_ = auVar27._0_4_;
          auVar49._4_12_ = auVar66._4_12_;
          auVar26 = vshufps_avx(auVar49,auVar52,0x11);
          uVar24 = vcmpps_avx512vl(auVar28,auVar26,2);
          uVar17 = vcmpps_avx512vl(auVar26,auVar28,2);
          auVar28 = vpmovm2d_avx512vl(uVar17);
          auVar26 = vpmovm2d_avx512vl(uVar24);
          auVar28 = vpblendd_avx2(auVar26,auVar28,6);
          uVar24 = vpmovd2m_avx512vl(auVar28);
          if ((~(ushort)uVar24 & 0xf) == 0) {
            cp_02.n = 4;
            cp_02.ptr = pPVar22;
            bVar20 = RecursiveIntersect(this,ray,tMax,cp_02,ObjectFromRay,auVar67._0_4_,u1_00,
                                        depth + -1,si);
            auVar66 = ZEXT1264(ZEXT812(0));
            auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
            if ((si == (optional<pbrt::ShapeIntersection> *)0x0) && (bVar20)) {
              return true;
            }
          }
        }
      }
      auVar67 = ZEXT464((uint)u1_00);
      lVar21 = 1;
      bVar20 = false;
    } while (bVar23);
    if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
      return si->set;
    }
  }
  return false;
}

Assistant:

bool Curve::RecursiveIntersect(const Ray &ray, Float tMax, pstd::span<const Point3f> cp,
                               const Transform &ObjectFromRay, Float u0, Float u1,
                               int depth, pstd::optional<ShapeIntersection> *si) const {
    Float rayLength = Length(ray.d);
    if (depth > 0) {
        // Split curve segment into sub-segments and test for intersection
        pstd::array<Point3f, 7> cpSplit = SubdivideCubicBezier(cp);
        Float u[3] = {u0, (u0 + u1) / 2, u1};
        for (int seg = 0; seg < 2; ++seg) {
            // Check ray against curve segment's bounding box
            Float maxWidth =
                std::max(Lerp(u[seg], common->width[0], common->width[1]),
                         Lerp(u[seg + 1], common->width[0], common->width[1]));
            pstd::span<const Point3f> cps = pstd::MakeConstSpan(&cpSplit[3 * seg], 4);
            Bounds3f curveBounds =
                Union(Bounds3f(cps[0], cps[1]), Bounds3f(cps[2], cps[3]));
            curveBounds = Expand(curveBounds, 0.5f * maxWidth);
            Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
            if (!Overlaps(rayBounds, curveBounds))
                continue;

            // Recursively test ray-segment intersection
            bool hit = RecursiveIntersect(ray, tMax, cps, ObjectFromRay, u[seg],
                                          u[seg + 1], depth - 1, si);
            if (hit && si == nullptr)
                return true;
        }
        return si ? si->has_value() : false;

    } else {
        // Intersect ray with curve segment
        // Test ray against segment endpoint boundaries
        // Test sample point against tangent perpendicular at curve start
        Float edge = (cp[1].y - cp[0].y) * -cp[0].y + cp[0].x * (cp[0].x - cp[1].x);
        if (edge < 0)
            return false;

        // Test sample point against tangent perpendicular at curve end
        edge = (cp[2].y - cp[3].y) * -cp[3].y + cp[3].x * (cp[3].x - cp[2].x);
        if (edge < 0)
            return false;

        // Find line $w$ that gives minimum distance to sample point
        Vector2f segmentDir = Point2f(cp[3].x, cp[3].y) - Point2f(cp[0].x, cp[0].y);
        Float denom = LengthSquared(segmentDir);
        if (denom == 0)
            return false;
        Float w = Dot(-Vector2f(cp[0].x, cp[0].y), segmentDir) / denom;

        // Compute $u$ coordinate of curve intersection point and _hitWidth_
        Float u = Clamp(Lerp(w, u0, u1), u0, u1);
        Float hitWidth = Lerp(u, common->width[0], common->width[1]);
        Normal3f nHit;
        if (common->type == CurveType::Ribbon) {
            // Scale _hitWidth_ based on ribbon orientation
            Float sin0 =
                std::sin((1 - u) * common->normalAngle) * common->invSinNormalAngle;
            Float sin1 = std::sin(u * common->normalAngle) * common->invSinNormalAngle;
            nHit = sin0 * common->n[0] + sin1 * common->n[1];
            hitWidth *= AbsDot(nHit, ray.d) / rayLength;
        }

        // Test intersection point against curve width
        Vector3f dpcdw;
        Point3f pc =
            EvaluateCubicBezier(pstd::span<const Point3f>(cp), Clamp(w, 0, 1), &dpcdw);
        Float ptCurveDist2 = pc.x * pc.x + pc.y * pc.y;
        if (ptCurveDist2 > hitWidth * hitWidth * .25f)
            return false;
        if (pc.z < 0 || pc.z > rayLength * tMax)
            return false;

        if (si != nullptr) {
            // Initialize _ShapeIntersection_ for curve intersection
            // Compute _tHit_ for curve intersection
            // FIXME: this tHit isn't quite right for ribbons...
            Float tHit = pc.z / rayLength;
            if (si->has_value() && tHit > si->value().tHit)
                return false;

            // Initialize _SurfaceInteraction_ _intr_ for curve intersection
            // Compute $v$ coordinate of curve intersection point
            Float ptCurveDist = std::sqrt(ptCurveDist2);
            Float edgeFunc = dpcdw.x * -pc.y + pc.x * dpcdw.y;
            Float v = (edgeFunc > 0) ? 0.5f + ptCurveDist / hitWidth
                                     : 0.5f - ptCurveDist / hitWidth;

            // Compute $\dpdu$ and $\dpdv$ for curve intersection
            Vector3f dpdu, dpdv;
            EvaluateCubicBezier(pstd::MakeConstSpan(common->cpObj), u, &dpdu);
            CHECK_NE(Vector3f(0, 0, 0), dpdu);
            if (common->type == CurveType::Ribbon)
                dpdv = Normalize(Cross(nHit, dpdu)) * hitWidth;
            else {
                // Compute curve $\dpdv$ for flat and cylinder curves
                Vector3f dpduPlane = ObjectFromRay.ApplyInverse(dpdu);
                Vector3f dpdvPlane =
                    Normalize(Vector3f(-dpduPlane.y, dpduPlane.x, 0)) * hitWidth;
                if (common->type == CurveType::Cylinder) {
                    // Rotate _dpdvPlane_ to give cylindrical appearance
                    Float theta = Lerp(v, -90., 90.);
                    Transform rot = Rotate(-theta, dpduPlane);
                    dpdvPlane = rot(dpdvPlane);
                }
                dpdv = ObjectFromRay(dpdvPlane);
            }

            // Compute error bounds for curve intersection
            Vector3f pError(2 * hitWidth, 2 * hitWidth, 2 * hitWidth);

            bool flipNormal =
                common->reverseOrientation ^ common->transformSwapsHandedness;
            Point3fi pi(ray(tHit), pError);
            SurfaceInteraction intr(pi, {u, v}, -ray.d, dpdu, dpdv, Normal3f(),
                                    Normal3f(), ray.time, flipNormal);
            intr = (*common->renderFromObject)(intr);

            *si = ShapeIntersection{intr, tHit};
        }
#ifndef PBRT_IS_GPU_CODE
        ++nCurveHits;
#endif
        return true;
    }
}